

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_gather_sampler_cube
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  long lVar1;
  bool bVar2;
  char *__s;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  string shaderSource;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  _Var6._M_p = (pointer)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe28,"textureGrad - samplerCube","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffe28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != &local_1c8) {
    operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
  }
  lVar5 = 0;
  do {
    shaderType = *(ShaderType *)((long)&(anonymous_namespace)::s_shaders + lVar5);
    bVar2 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar2) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_1b1);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x9ba7d3);
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 == paVar4) {
        local_1c8._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_1c8._8_8_ = plVar3[3];
        _Var6._M_p = (pointer)&local_1c8;
      }
      else {
        local_1c8._M_allocated_capacity = paVar4->_M_allocated_capacity;
        _Var6._M_p = (pointer)*plVar3;
      }
      lVar1 = plVar3[1];
      *plVar3 = (long)paVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffe28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x29,TYPE_FLOAT,TYPE_LAST,
                 (DataType)_Var6._M_p);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x29,TYPE_FLOAT_VEC3,TYPE_FLOAT,
                 (DataType)_Var6._M_p);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x29,TYPE_FLOAT,TYPE_INT,
                 (DataType)_Var6._M_p);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x36,TYPE_FLOAT,TYPE_LAST,
                 (DataType)_Var6._M_p);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_d0,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x36,TYPE_FLOAT_VEC3,TYPE_FLOAT,
                 (DataType)_Var6._M_p);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f0,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x36,TYPE_FLOAT,TYPE_INT,
                 (DataType)_Var6._M_p);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_110,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x3d,TYPE_FLOAT,TYPE_LAST,
                 (DataType)_Var6._M_p);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_130,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x3d,TYPE_FLOAT_VEC3,TYPE_FLOAT,
                 (DataType)_Var6._M_p);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_150,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x3d,TYPE_FLOAT,TYPE_INT,
                 (DataType)_Var6._M_p);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_170,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x40,TYPE_FLOAT_VEC3,TYPE_LAST,
                 (DataType)_Var6._M_p);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_190,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x40,TYPE_FLOAT_VEC3,TYPE_INT,
                 (DataType)_Var6._M_p);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_1b0,_Var6._M_p,_Var6._M_p + lVar1);
      verifyShader(ctx,shaderType,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1c8) {
        operator_delete(_Var6._M_p,local_1c8._M_allocated_capacity + 1);
      }
      NegativeTestContext::endSection(ctx);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x18);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_gather_sampler_cube (NegativeTestContext& ctx)
{
	ctx.beginSection("textureGrad - samplerCube");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}